

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int r,int lv,int prow,int pcol,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *pval,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  cpp_dec_float<200U,_int,_void> *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  self_type *in_RDI;
  int in_R8D;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R9;
  int n;
  int m;
  int ll;
  int k;
  int j;
  int i;
  int c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lx;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int fill;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff8c8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f4;
  undefined1 local_708 [128];
  undefined1 local_688 [80];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_608;
  undefined1 local_588 [128];
  int in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffb10;
  undefined1 local_488 [128];
  undefined1 local_408 [128];
  undefined1 local_388 [128];
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2ec;
  undefined1 local_26c [128];
  int local_1ec;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined1 *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  undefined1 *local_1b8;
  reference local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  undefined1 *local_148;
  reference local_140;
  cpp_dec_float<200U,_int,_void> *local_138;
  reference local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  cpp_dec_float<200U,_int,_void> *local_118;
  reference local_110;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  reference local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  reference local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  reference local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  local_1c8 = local_26c;
  local_1e0 = in_R8D;
  local_1dc = in_ECX;
  local_1d8 = in_EDX;
  local_1d4 = in_ESI;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8d0);
  local_1c0 = &local_2ec;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8d0);
  local_308 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 6) + (long)local_1d4 * 4);
  lVar3 = *(long *)(in_RDI[7].m_backend.data._M_elems + 8);
  local_304 = *(int *)(lVar3 + (long)local_1d4 * 4) + -1;
  *(int *)(lVar3 + (long)local_1d4 * 4) = local_304;
  local_304 = local_304 + local_308;
  local_2f8 = local_304;
  while (*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_2f8 * 4) !=
         local_1e0) {
    local_2f8 = local_2f8 + -1;
  }
  local_e0 = std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)&in_RDI[6].m_backend.fpclass,(long)local_2f8);
  local_d8 = local_388;
  local_e8 = in_R9;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_e9,local_e0,in_R9);
  local_d0 = local_388;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff8d0);
  local_b8 = local_388;
  local_c0 = local_e0;
  local_c8 = local_e8;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
             (cpp_dec_float<200U,_int,_void> *)0x6d9520);
  local_150 = &local_2ec;
  local_158 = local_388;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  local_100 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)(in_RDI[5].m_backend.data._M_elems + 0xe),(long)local_1d8);
  local_108 = &local_2ec;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  *(int *)(*(long *)(in_RDI[5].m_backend.data._M_elems + 0x14) + (long)local_1d8 * 4) = local_1d4;
  local_1d8 = local_1d8 + 1;
  *(undefined4 *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_2f8 * 4) =
       *(undefined4 *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_304 * 4);
  this_00 = &std::
             vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           *)&in_RDI[6].m_backend.fpclass,(long)local_304)->m_backend;
  local_110 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)&in_RDI[6].m_backend.fpclass,(long)local_2f8);
  local_118 = this_00;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (this_00,in_stack_fffffffffffff8c8);
  local_1ec = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1dc * 4);
  local_2f8 = local_304;
  while (local_2f8 = local_2f8 + -1, local_308 <= local_2f8) {
    local_2f0 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_2f8 * 4);
    if (*(int *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 0xe) + (long)local_2f0 * 4) != 0) {
      *(undefined4 *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 0xe) + (long)local_2f0 * 4) = 0;
      local_1ec = local_1ec + -1;
      local_60 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 4) + (long)local_2f0 * 0x80);
      local_58 = local_408;
      local_68 = &local_2ec;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_69,local_60,local_68);
      local_50 = local_408;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
      local_38 = local_408;
      local_40 = local_60;
      local_48 = local_68;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (this_00,in_stack_fffffffffffff8c8,(cpp_dec_float<200U,_int,_void> *)0x6d97c4);
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    *)&in_RDI[6].m_backend.fpclass,(long)local_2f8);
      local_128 = boost::multiprecision::
                  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                               in_RDI);
      local_120 = local_26c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (this_00,in_stack_fffffffffffff8c8);
      local_1a0 = local_488;
      local_1a8 = local_26c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff8c8);
      local_190 = &stack0xfffffffffffffaf8;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff8c8);
      bVar5 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      if (bVar5) {
        lVar3 = *(long *)(in_RDI[7].m_backend.data._M_elems + 8);
        *(int *)(lVar3 + (long)local_1d4 * 4) = *(int *)(lVar3 + (long)local_1d4 * 4) + -1;
        local_304 = local_304 + -1;
        in_stack_fffffffffffff8c8 =
             &std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)&in_RDI[6].m_backend.fpclass,(long)local_304)->m_backend;
        local_130 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)&in_RDI[6].m_backend.fpclass,(long)local_2f8);
        local_138 = in_stack_fffffffffffff8c8;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,in_stack_fffffffffffff8c8);
        *(undefined4 *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_2f8 * 4) =
             *(undefined4 *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_304 * 4)
        ;
        lVar3 = *(long *)(in_RDI[8].m_backend.data._M_elems + 0x16);
        *(int *)(lVar3 + (long)local_2f0 * 4) = *(int *)(lVar3 + (long)local_2f0 * 4) + -1;
        lVar3 = *(long *)in_RDI[8].m_backend.data._M_elems;
        local_2fc = *(int *)(lVar3 + (long)local_2f0 * 4) + -1;
        *(int *)(lVar3 + (long)local_2f0 * 4) = local_2fc;
        local_2fc = local_2fc +
                    *(int *)(*(long *)&in_RDI[7].m_backend.fpclass + (long)local_2f0 * 4);
        local_2f4 = local_2fc;
        while (*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 0x16) + (long)local_2f4 * 4)
               != local_1d4) {
          local_2f4 = local_2f4 + -1;
        }
        *(undefined4 *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 0x16) + (long)local_2f4 * 4) =
             *(undefined4 *)
              (*(long *)(in_RDI[7].m_backend.data._M_elems + 0x16) + (long)local_2fc * 4);
      }
    }
  }
  local_300 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1d4 * 4);
  if (*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 10) + (long)local_1d4 * 4) <
      local_300 + local_1ec) {
    remaxRow(in_stack_fffffffffffffb10,in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08);
  }
  local_300 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 6) + (long)local_1d4 * 4) +
              local_300;
  local_2f8 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 6) + (long)local_1dc * 4);
  local_304 = local_2f8 +
              *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1dc * 4);
  for (; local_2f8 < local_304; local_2f8 = local_2f8 + 1) {
    local_2f0 = *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_2f8 * 4);
    if (*(int *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 0xe) + (long)local_2f0 * 4) == 0) {
      *(undefined4 *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 0xe) + (long)local_2f0 * 4) = 1;
    }
    else {
      local_28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 4) + (long)local_2f0 * 0x80);
      local_20 = &local_608;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_29,local_28);
      local_10 = &local_608;
      local_18 = local_28;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff8c8);
      local_8 = &local_608;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(this_00);
      local_98 = local_588;
      local_a0 = &local_608;
      local_a8 = &local_2ec;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a9,local_a0,local_a8);
      local_90 = local_588;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(this_00);
      local_78 = local_588;
      local_80 = local_a0;
      local_88 = local_a8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (this_00,in_stack_fffffffffffff8c8,(cpp_dec_float<200U,_int,_void> *)0x6d9c87);
      local_160 = local_26c;
      local_168 = local_588;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (this_00,in_stack_fffffffffffff8c8);
      local_180 = local_688;
      local_188 = local_26c;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff8c8);
      local_170 = local_708;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                (this_00,in_stack_fffffffffffff8c8);
      bVar5 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      if (bVar5) {
        local_140 = std::
                    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  *)&in_RDI[6].m_backend.fpclass,(long)local_300);
        local_148 = local_26c;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (this_00,in_stack_fffffffffffff8c8);
        *(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 4) + (long)local_300 * 4) = local_2f0
        ;
        local_300 = local_300 + 1;
        lVar3 = *(long *)(in_RDI[7].m_backend.data._M_elems + 8);
        *(int *)(lVar3 + (long)local_1d4 * 4) = *(int *)(lVar3 + (long)local_1d4 * 4) + 1;
        if (*(int *)(*(long *)(in_RDI[8].m_backend.data._M_elems + 2) + (long)local_2f0 * 4) <=
            *(int *)(*(long *)in_RDI[8].m_backend.data._M_elems + (long)local_2f0 * 4)) {
          remaxCol(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8);
        }
        lVar3 = *(long *)(in_RDI[7].m_backend.data._M_elems + 0x16);
        iVar1 = *(int *)(*(long *)&in_RDI[7].m_backend.fpclass + (long)local_2f0 * 4);
        lVar4 = *(long *)in_RDI[8].m_backend.data._M_elems;
        iVar2 = *(int *)(lVar4 + (long)local_2f0 * 4);
        *(int *)(lVar4 + (long)local_2f0 * 4) = iVar2 + 1;
        *(int *)(lVar3 + (long)(iVar1 + iVar2) * 4) = local_1d4;
        lVar3 = *(long *)(in_RDI[8].m_backend.data._M_elems + 0x16);
        *(int *)(lVar3 + (long)local_2f0 * 4) = *(int *)(lVar3 + (long)local_2f0 * 4) + 1;
      }
    }
  }
  *(undefined8 *)
   (*(long *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20) + 8) =
       *(undefined8 *)
        (*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20 + 8);
  **(undefined8 **)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20 + 8) =
       *(undefined8 *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20);
  *(undefined8 *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20) =
       *(undefined8 *)
        (*(long *)(in_RDI[9].m_backend.data._M_elems + 8) +
        (long)*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1d4 * 4) *
        0x20);
  *(long *)(*(long *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20) + 8
           ) = *(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20;
  *(long *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20 + 8) =
       *(long *)(in_RDI[9].m_backend.data._M_elems + 8) +
       (long)*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1d4 * 4) * 0x20
  ;
  *(long *)(*(long *)(in_RDI[9].m_backend.data._M_elems + 8) +
           (long)*(int *)(*(long *)(in_RDI[7].m_backend.data._M_elems + 8) + (long)local_1d4 * 4) *
           0x20) = *(long *)(in_RDI[9].m_backend.data._M_elems + 6) + (long)local_1d4 * 0x20;
  local_1b0 = std::
              vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::operator[]((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            *)(in_RDI[8].m_backend.data._M_elems + 0x10),(long)local_1d4);
  local_1b8 = &stack0xfffffffffffff8f4;
  local_f8 = local_1b8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (this_00,(long_long_type)in_stack_fffffffffffff8c8);
  return local_1d8;
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}